

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O1

region * __thiscall
toml::detail::character_either::scan
          (region *__return_storage_ptr__,character_either *this,location *loc)

{
  element_type *peVar1;
  pointer puVar2;
  long lVar3;
  pointer puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  uchar uVar9;
  bool bVar10;
  location first;
  location local_60;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    puVar4 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar10 = puVar4 == puVar2;
    if (!bVar10) {
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      do {
        if (loc->location_ <
            (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish - lVar3)) {
          uVar9 = *(uchar *)(lVar3 + loc->location_);
        }
        else {
          uVar9 = '\0';
        }
        if (uVar9 == *puVar4) {
          location::location(&local_60,loc);
          peVar1 = (loc->source_).
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          uVar6 = loc->location_;
          lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start;
          uVar7 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - lVar3;
          if (uVar6 + 1 < uVar7) {
            if (*(char *)(lVar3 + uVar6) == '\n') {
              loc->line_number_ = loc->line_number_ + 1;
              sVar5 = 1;
            }
            else {
              sVar5 = loc->column_number_ + 1;
            }
            loc->column_number_ = sVar5;
            uVar7 = uVar6 + 1;
          }
          else if (uVar7 != uVar6) {
            sVar5 = loc->line_number_;
            sVar8 = loc->column_number_;
            do {
              if (*(char *)(lVar3 + uVar6) == '\n') {
                sVar5 = sVar5 + 1;
                loc->line_number_ = sVar5;
                sVar8 = 1;
              }
              else {
                sVar8 = sVar8 + 1;
              }
              loc->column_number_ = sVar8;
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
          }
          loc->location_ = uVar7;
          (__return_storage_ptr__->source_).
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_60.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (__return_storage_ptr__->source_).
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               local_60.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if (local_60.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_60.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_60.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_60.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_60.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          (__return_storage_ptr__->source_name_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->source_name_).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->source_name_,
                     local_60.source_name_._M_dataplus._M_p,
                     local_60.source_name_._M_dataplus._M_p + local_60.source_name_._M_string_length
                    );
          __return_storage_ptr__->first_ = local_60.location_;
          __return_storage_ptr__->first_line_ = local_60.line_number_;
          __return_storage_ptr__->first_column_ = local_60.column_number_;
          sVar5 = loc->location_;
          sVar8 = loc->line_number_;
          __return_storage_ptr__->length_ = sVar5 - local_60.location_;
          __return_storage_ptr__->last_ = sVar5;
          __return_storage_ptr__->last_line_ = sVar8;
          __return_storage_ptr__->last_column_ = loc->column_number_;
          location::~location(&local_60);
          if (!bVar10) {
            return __return_storage_ptr__;
          }
          break;
        }
        puVar4 = puVar4 + 1;
        bVar10 = puVar4 == puVar2;
      } while (!bVar10);
    }
  }
  region::region(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region character_either::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    for(const auto c : this->chars_)
    {
        if(loc.current() == c)
        {
            const auto first = loc;
            loc.advance(1);
            return region(first, loc);
        }
    }
    return region{};
}